

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderReturnTests.cpp
# Opt level: O2

void deqp::gles2::Functional::evalReturnDynamic(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  float fVar4;
  Vector<float,_3> local_24;
  VecAccess<float,_4,_3> local_18;
  
  fVar1 = (c->coords).m_data[0];
  fVar2 = (c->coords).m_data[1];
  fVar4 = fVar1 + fVar2;
  local_24.m_data[1] = (c->coords).m_data[2];
  uVar3 = -(uint)(fVar4 < 0.0);
  local_24.m_data[0] = (float)(~uVar3 & (uint)fVar1 | (uint)(c->coords).m_data[3] & uVar3);
  local_24.m_data[2] = fVar2;
  if (0.0 <= fVar4) {
    local_24.m_data[2] = local_24.m_data[1];
    local_24.m_data[1] = fVar2;
  }
  local_18.m_vector = &c->color;
  local_18.m_index[0] = 0;
  local_18.m_index[1] = 1;
  local_18.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_18,&local_24);
  return;
}

Assistant:

inline void evalReturnDynamic	(ShaderEvalContext& c) { c.color.xyz() = (c.coords.x()+c.coords.y() >= 0.0f) ? c.coords.swizzle(0,1,2) : c.coords.swizzle(3,2,1); }